

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_move.cpp
# Opt level: O0

void __thiscall DBot::Pitch(DBot *this,AActor *target)

{
  double dVar1;
  double dVar2;
  double dVar3;
  TAngle<double> local_30;
  double local_28;
  double diff;
  double aim;
  AActor *target_local;
  DBot *this_local;
  
  aim = (double)target;
  target_local = (AActor *)this;
  dVar1 = AActor::Z(target);
  dVar2 = AActor::Z(&this->player->mo->super_AActor);
  local_28 = dVar1 - dVar2;
  dVar3 = AActor::Distance2D(&this->player->mo->super_AActor,(AActor *)aim,false);
  diff = c_atan((dVar1 - dVar2) / dVar3);
  TAngle<double>::ToDegrees(&local_30,diff);
  TAngle<double>::operator=(&(this->player->mo->super_AActor).Angles.Pitch,&local_30);
  return;
}

Assistant:

void DBot::Pitch (AActor *target)
{
	double aim;
	double diff;

	diff = target->Z() - player->mo->Z();
	aim = g_atan(diff / player->mo->Distance2D(target));
	player->mo->Angles.Pitch = DAngle::ToDegrees(aim);
}